

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Vec_Wec_t * Gia_ManCreateCoSupps(Gia_Man_t *p,int fVerbose)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  undefined8 uVar4;
  int *piVar5;
  int iVar6;
  Vec_Wec_t *pVVar7;
  Vec_Int_t *pVVar8;
  int *__ptr;
  void *pvVar9;
  int iVar10;
  uint uVar11;
  int *piVar12;
  long lVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  size_t __size;
  int *piVar18;
  long lVar19;
  long lVar20;
  timespec ts;
  long local_58;
  timespec local_40;
  
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    local_58 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_58 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  iVar6 = p->vCos->nSize;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  iVar10 = iVar6;
  if (iVar6 - 1U < 7) {
    iVar10 = 8;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar10;
  if (iVar10 == 0) {
    pVVar8 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar8 = (Vec_Int_t *)calloc((long)iVar10,0x10);
  }
  pVVar7->pArray = pVVar8;
  pVVar7->nSize = iVar6;
  iVar6 = p->nObjs;
  __ptr = (int *)malloc(0x10);
  iVar10 = 8;
  if (6 < iVar6 - 1U) {
    iVar10 = iVar6;
  }
  __ptr[1] = 0;
  *__ptr = iVar10;
  if (iVar10 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = calloc((long)iVar10,0x10);
  }
  *(void **)(__ptr + 2) = pvVar9;
  __ptr[1] = iVar6;
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      iVar10 = pVVar8->pArray[lVar13];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_00682d5e;
      if (iVar10 == 0) break;
      if (iVar6 <= iVar10) goto LAB_00682d3f;
      Vec_IntPush((Vec_Int_t *)((long)iVar10 * 0x10 + (long)pvVar9),(int)lVar13);
      lVar13 = lVar13 + 1;
      pVVar8 = p->vCis;
    } while (lVar13 < pVVar8->nSize);
  }
  if (0 < p->nObjs) {
    lVar13 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar4 = *(undefined8 *)(p->pObjs + lVar13);
      uVar11 = (uint)uVar4;
      if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
        uVar11 = (int)lVar13 - (uVar11 & 0x1fffffff);
        if ((int)uVar11 < 0) goto LAB_00682d3f;
        iVar6 = __ptr[1];
        if ((((iVar6 <= (int)uVar11) ||
             (uVar17 = (int)lVar13 - ((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff), (int)uVar17 < 0))
            || (iVar6 <= (int)uVar17)) || (iVar6 <= lVar13)) goto LAB_00682d3f;
        lVar20 = *(long *)(__ptr + 2);
        lVar16 = (ulong)uVar11 * 0x10 + lVar20;
        lVar15 = (ulong)uVar17 * 0x10 + lVar20;
        piVar1 = (int *)(lVar20 + lVar13 * 0x10);
        lVar19 = (long)*(int *)(lVar15 + 4) + (long)*(int *)(lVar16 + 4);
        iVar6 = (int)lVar19;
        if (*(int *)(lVar20 + lVar13 * 0x10) < iVar6) {
          __size = lVar19 * 4;
          if (*(void **)(piVar1 + 2) == (void *)0x0) {
            pvVar9 = malloc(__size);
          }
          else {
            pvVar9 = realloc(*(void **)(piVar1 + 2),__size);
          }
          *(void **)(piVar1 + 2) = pvVar9;
          if (pvVar9 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          *piVar1 = iVar6;
        }
        piVar5 = *(int **)(piVar1 + 2);
        piVar18 = *(int **)(lVar16 + 8);
        piVar12 = *(int **)(lVar15 + 8);
        piVar2 = piVar18 + *(int *)(lVar16 + 4);
        piVar3 = piVar12 + *(int *)(lVar15 + 4);
        piVar14 = piVar5;
        if ((0 < (long)*(int *)(lVar16 + 4)) && (0 < *(int *)(lVar15 + 4))) {
          do {
            iVar6 = *piVar18;
            iVar10 = *piVar12;
            if (iVar6 == iVar10) {
              piVar18 = piVar18 + 1;
              *piVar14 = iVar6;
              piVar12 = piVar12 + 1;
            }
            else if (iVar6 < iVar10) {
              piVar18 = piVar18 + 1;
              *piVar14 = iVar6;
            }
            else {
              piVar12 = piVar12 + 1;
              *piVar14 = iVar10;
            }
            piVar14 = piVar14 + 1;
          } while ((piVar18 < piVar2) && (piVar12 < piVar3));
        }
        for (; piVar18 < piVar2; piVar18 = piVar18 + 1) {
          *piVar14 = *piVar18;
          piVar14 = piVar14 + 1;
        }
        for (; piVar12 < piVar3; piVar12 = piVar12 + 1) {
          *piVar14 = *piVar12;
          piVar14 = piVar14 + 1;
        }
        iVar6 = (int)((ulong)((long)piVar14 - (long)piVar5) >> 2);
        piVar1[1] = iVar6;
        if (*piVar1 < iVar6) {
          __assert_fail("vArr->nSize <= vArr->nCap",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x6ec,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar6 < *(int *)(lVar16 + 4)) {
          __assert_fail("vArr->nSize >= vArr1->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x6ed,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar6 < *(int *)(lVar15 + 4)) {
          __assert_fail("vArr->nSize >= vArr2->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x6ee,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < p->nObjs);
  }
  pVVar8 = p->vCos;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      iVar6 = pVVar8->pArray[lVar13];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_00682d5e:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (((pVVar7->nSize <= lVar13) ||
          (uVar11 = iVar6 - (*(uint *)(p->pObjs + iVar6) & 0x1fffffff), (int)uVar11 < 0)) ||
         (__ptr[1] <= (int)uVar11)) {
LAB_00682d3f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (0 < *(int *)(*(long *)(__ptr + 2) + 4 + (ulong)uVar11 * 0x10)) {
        pVVar8 = pVVar7->pArray;
        lVar15 = *(long *)(__ptr + 2) + (ulong)uVar11 * 0x10;
        lVar20 = 0;
        do {
          Vec_IntPush(pVVar8 + lVar13,*(int *)(*(long *)(lVar15 + 8) + lVar20 * 4));
          lVar20 = lVar20 + 1;
        } while (lVar20 < *(int *)(lVar15 + 4));
      }
      lVar13 = lVar13 + 1;
      pVVar8 = p->vCos;
    } while (lVar13 < pVVar8->nSize);
  }
  iVar6 = *__ptr;
  if (0 < (long)iVar6) {
    lVar13 = *(long *)(__ptr + 2);
    lVar20 = 0;
    do {
      pvVar9 = *(void **)(lVar13 + 8 + lVar20);
      if (pvVar9 != (void *)0x0) {
        free(pvVar9);
        *(undefined8 *)(lVar13 + 8 + lVar20) = 0;
      }
      lVar20 = lVar20 + 0x10;
    } while ((long)iVar6 * 0x10 != lVar20);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  __ptr[0] = 0;
  __ptr[1] = 0;
  free(__ptr);
  if (fVerbose != 0) {
    iVar6 = clock_gettime(3,&local_40);
    if (iVar6 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(1,"%s =","Support computation");
    Abc_Print(1,"%9.2f sec\n",(double)(lVar13 + local_58) / 1000000.0);
  }
  return pVVar7;
}

Assistant:

Vec_Wec_t * Gia_ManCreateCoSupps( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; int i, Id;
    Vec_Wec_t * vSuppsCo = Vec_WecStart( Gia_ManCoNum(p) );
    Vec_Wec_t * vSupps = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        Vec_IntPush( Vec_WecEntry(vSupps, Id), i );
    Gia_ManForEachAnd( p, pObj, Id )
        Vec_IntTwoMerge2( Vec_WecEntry(vSupps, Gia_ObjFaninId0(pObj, Id)), 
                          Vec_WecEntry(vSupps, Gia_ObjFaninId1(pObj, Id)), 
                          Vec_WecEntry(vSupps, Id) ); 
    Gia_ManForEachCo( p, pObj, i )
        Vec_IntAppend( Vec_WecEntry(vSuppsCo, i), Vec_WecEntry(vSupps, Gia_ObjFaninId0p(p, pObj)) );
    Vec_WecFree( vSupps );
    if ( fVerbose )
        Abc_PrintTime( 1, "Support computation", Abc_Clock() - clk );
    return vSuppsCo;
}